

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O0

uint8_t * pvpatch(uint8_t *p,uint32_t size,...)

{
  undefined4 *local_100;
  undefined4 local_e8 [44];
  uint local_38;
  va_list arg;
  uint local_18;
  uint32_t i;
  uint32_t size_local;
  uint8_t *p_local;
  
  arg[0]._0_8_ = &stack0x00000008;
  local_38 = 0x10;
  _i = p;
  for (local_18 = 0; local_18 < size; local_18 = local_18 + 1) {
    if (local_38 < 0x29) {
      local_100 = (undefined4 *)((long)local_e8 + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_100 = (undefined4 *)arg[0]._0_8_;
      arg[0]._0_8_ = arg[0]._0_8_ + 8;
    }
    *_i = (uint8_t)*local_100;
    _i = _i + 1;
  }
  return _i;
}

Assistant:

uint8_t *pvpatch(uint8_t *p, const uint32_t size, ...)
{
    uint32_t i;
    va_list arg;

    va_start(arg, size);

    for (i=0; i < size; i++) {
        *(p++) = va_arg(arg, int);
    }
    va_end(arg);
    return p;

}